

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  Byte *pBVar6;
  CPpmd_State *pCVar7;
  bool bVar8;
  UInt16 UVar9;
  UInt32 UVar10;
  uint uVar11;
  int iVar12;
  UInt32 UVar13;
  long *plVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  UInt16 *pUVar18;
  byte *pbVar19;
  uint unaff_EBP;
  CPpmd7_Context *pCVar20;
  uint uVar21;
  uint uVar22;
  UInt32 freqSum;
  size_t charMask [32];
  CPpmd_State *ps [256];
  UInt32 local_948;
  uint local_944;
  CPpmd_See *local_940;
  char local_938 [256];
  long local_838 [257];
  
  pCVar20 = p->MinContext;
  local_944 = unaff_EBP;
  if (pCVar20->NumStats == 1) {
    bVar1 = *(byte *)((long)&pCVar20->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar20->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar18 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)pCVar20->SummFreq] * 2);
    UVar10 = (*rc->DecodeBit)(rc,(uint)*pUVar18);
    uVar4 = *pUVar18;
    if (UVar10 == 0) {
      *pUVar18 = (uVar4 - (short)(uVar4 + 0x20 >> 7)) + 0x80;
      pCVar20 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar20->SummFreq;
      UVar9 = pCVar20->SummFreq;
      bVar1 = *(byte *)((long)&pCVar20->SummFreq + 1);
      *(byte *)((long)&pCVar20->SummFreq + 1) = bVar1 - ((char)~bVar1 >> 7);
      p->PrevSuccess = 1;
      p->RunLength = p->RunLength + 1;
      NextContext(p);
      return (uint)(byte)UVar9;
    }
    uVar11 = (uint)uVar4 - (uVar4 + 0x20 >> 7);
    *pUVar18 = (ushort)uVar11;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar11 & 0xffff) >> 10];
    memset(local_938,0xff,0x100);
    local_938[(byte)p->MinContext->SummFreq] = '\0';
    p->PrevSuccess = 0;
  }
  else {
    pBVar6 = p->Base;
    uVar17 = (ulong)pCVar20->Stats;
    UVar10 = (*rc->GetThreshold)(rc,(uint)pCVar20->SummFreq);
    bVar1 = pBVar6[uVar17 + 1];
    if (UVar10 < bVar1) {
      bVar8 = false;
      (*rc->Decode)(rc,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar17);
      bVar1 = ((CPpmd_State *)(pBVar6 + uVar17))->Symbol;
      Ppmd7_Update1_0(p);
      local_944 = (uint)bVar1;
    }
    else {
      p->PrevSuccess = 0;
      iVar12 = p->MinContext->NumStats - 1;
      pbVar15 = pBVar6 + (uVar17 - 6);
      uVar11 = (uint)bVar1;
      do {
        pbVar19 = pbVar15;
        UVar13 = uVar11 + pbVar19[0xd];
        if (UVar10 < UVar13) {
          (*rc->Decode)(rc,uVar11,(uint)pbVar19[0xd]);
          p->FoundState = (CPpmd_State *)(pbVar19 + 0xc);
          bVar1 = pbVar19[0xc];
          Ppmd7_Update1(p);
          local_944 = (uint)bVar1;
          goto LAB_004e05da;
        }
        pbVar15 = pbVar19 + 6;
        iVar12 = iVar12 + -1;
        uVar11 = UVar13;
      } while (iVar12 != 0);
      uVar11 = (uint)p->MinContext->SummFreq;
      if (UVar10 < uVar11) {
        p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
        (*rc->Decode)(rc,UVar13,uVar11 - UVar13);
        memset(local_938,0xff,0x100);
        local_938[pbVar19[0xc]] = '\0';
        iVar12 = p->MinContext->NumStats - 1;
        do {
          local_938[*pbVar15] = '\0';
          pbVar15 = pbVar15 + -6;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        bVar8 = true;
      }
      else {
        local_944 = 0xfffffffe;
LAB_004e05da:
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return local_944;
    }
  }
  do {
    pCVar20 = p->MinContext;
    uVar4 = pCVar20->NumStats;
    uVar11 = p->OrderFall;
    do {
      uVar17 = (ulong)pCVar20->Suffix;
      if (uVar17 == 0) {
        p->OrderFall = uVar11 + 1;
        local_944 = 0xffffffff;
        goto LAB_004e0746;
      }
      pBVar6 = p->Base;
      pCVar20 = (CPpmd7_Context *)(pBVar6 + uVar17);
      p->MinContext = pCVar20;
      uVar5 = *(ushort *)(pBVar6 + uVar17);
      uVar11 = uVar11 + 1;
    } while (uVar5 == uVar4);
    p->OrderFall = uVar11;
    pbVar15 = pBVar6 + *(uint *)(pBVar6 + uVar17 + 4);
    uVar22 = 0;
    uVar11 = 0;
    do {
      uVar16 = uVar11;
      uVar21 = (uint)local_938[*pbVar15];
      uVar22 = uVar22 + (pbVar15[1] & uVar21);
      local_838[uVar16] = (long)pbVar15;
      pbVar15 = pbVar15 + 6;
      uVar11 = uVar16 - uVar21;
    } while (uVar16 - uVar21 != (uint)uVar5 - (uint)uVar4);
    local_940 = Ppmd7_MakeEscFreq(p,(uint)uVar4,&local_948);
    UVar10 = local_948;
    uVar11 = local_948 + uVar22;
    local_948 = uVar11;
    UVar13 = (*rc->GetThreshold)(rc,uVar11);
    if (UVar13 < uVar22) {
      plVar14 = local_838;
      uVar11 = 0;
      do {
        UVar10 = uVar11;
        pCVar7 = (CPpmd_State *)*plVar14;
        uVar11 = UVar10 + pCVar7->Freq;
        plVar14 = plVar14 + 1;
      } while (uVar11 <= UVar13);
      (*rc->Decode)(rc,UVar10,(uint)pCVar7->Freq);
      bVar1 = local_940->Shift;
      if (bVar1 < 7) {
        pBVar6 = &local_940->Count;
        *pBVar6 = *pBVar6 + 0xff;
        if (*pBVar6 == '\0') {
          local_940->Summ = local_940->Summ << 1;
          local_940->Shift = bVar1 + 1;
          local_940->Count = (Byte)(3 << (bVar1 & 0x1f));
        }
      }
      p->FoundState = pCVar7;
      bVar1 = pCVar7->Symbol;
      Ppmd7_Update2(p);
      local_944 = (uint)bVar1;
LAB_004e0746:
      bVar8 = false;
    }
    else {
      if (uVar11 <= UVar13) {
        local_944 = 0xfffffffe;
        goto LAB_004e0746;
      }
      (*rc->Decode)(rc,uVar22,UVar10);
      local_940->Summ = local_940->Summ + (short)uVar11;
      iVar12 = uVar21 - uVar16;
      plVar14 = local_838 + (~uVar21 + uVar16);
      do {
        local_938[*(byte *)*plVar14] = '\0';
        plVar14 = plVar14 + -1;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
      bVar8 = true;
    }
    if (!bVar8) {
      return local_944;
    }
  } while( true );
}

Assistant:

static int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);

    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);

    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}